

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O2

void Nwk_ManGraphUpdate(Nwk_Grf_t *p,Nwk_Vrt_t *pVertex,Nwk_Vrt_t *pNext)

{
  int iVar1;
  Nwk_Vrt_t *pNVar2;
  Nwk_Vrt_t *pNVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  Nwk_ManGraphListExtract(p,pVertex);
  Nwk_ManGraphListExtract(p,pNext);
  lVar7 = 0;
  do {
    if (pVertex->nEdges <= lVar7) {
      lVar7 = 0;
      do {
        if (pNext->nEdges <= lVar7) {
          iVar4 = pVertex->Id;
          iVar1 = pNext->Id;
          iVar5 = iVar1;
          if (iVar4 < iVar1) {
            iVar5 = iVar4;
          }
          if (iVar4 < iVar1) {
            pVertex = pNext;
          }
          Vec_IntPush(p->vPairs,p->pMapId2Lut[iVar5]);
          Vec_IntPush(p->vPairs,p->pMapId2Lut[pVertex->Id]);
          return;
        }
        pNVar2 = p->pVerts[(&pNext[1].Id)[lVar7]];
        if (pNVar2 != pVertex) {
          Nwk_ManGraphListExtract(p,pNVar2);
          iVar4 = pNVar2->nEdges;
          if (1 < iVar4) {
            for (lVar6 = 0; lVar6 < iVar4; lVar6 = lVar6 + 1) {
              pNVar3 = p->pVerts[(&pNVar2[1].Id)[lVar6]];
              if ((pNVar3 != pNext) && (pNVar3->nEdges < 2)) {
                if (pNVar3->nEdges != 1) {
                  __assert_fail("pOther->nEdges == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                                ,0x1f7,
                                "void Nwk_ManGraphUpdate(Nwk_Grf_t *, Nwk_Vrt_t *, Nwk_Vrt_t *)");
                }
                Nwk_ManGraphListExtract(p,pNVar3);
                pNVar2->nEdges = pNVar2->nEdges + -1;
                Nwk_ManGraphListInsert(p,pNVar3);
                iVar4 = pNVar2->nEdges + 1;
                pNVar2->nEdges = iVar4;
              }
            }
          }
          Nwk_ManGraphVertexRemoveEdge(pNVar2,pNext);
          if (0 < pNVar2->nEdges) {
            Nwk_ManGraphListInsert(p,pNVar2);
          }
        }
        lVar7 = lVar7 + 1;
      } while( true );
    }
    pNVar2 = p->pVerts[(&pVertex[1].Id)[lVar7]];
    if (pNVar2 != pNext) {
      Nwk_ManGraphListExtract(p,pNVar2);
      iVar4 = pNVar2->nEdges;
      if (1 < iVar4) {
        for (lVar6 = 0; lVar6 < iVar4; lVar6 = lVar6 + 1) {
          pNVar3 = p->pVerts[(&pNVar2[1].Id)[lVar6]];
          if ((pNVar3 != pVertex) && (pNVar3->nEdges < 2)) {
            if (pNVar3->nEdges != 1) {
              __assert_fail("pOther->nEdges == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                            ,0x1df,"void Nwk_ManGraphUpdate(Nwk_Grf_t *, Nwk_Vrt_t *, Nwk_Vrt_t *)")
              ;
            }
            Nwk_ManGraphListExtract(p,pNVar3);
            pNVar2->nEdges = pNVar2->nEdges + -1;
            Nwk_ManGraphListInsert(p,pNVar3);
            iVar4 = pNVar2->nEdges + 1;
            pNVar2->nEdges = iVar4;
          }
        }
      }
      Nwk_ManGraphVertexRemoveEdge(pNVar2,pVertex);
      if (0 < pNVar2->nEdges) {
        Nwk_ManGraphListInsert(p,pNVar2);
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void Nwk_ManGraphUpdate( Nwk_Grf_t * p, Nwk_Vrt_t * pVertex, Nwk_Vrt_t * pNext )
{
    Nwk_Vrt_t * pChanged, * pOther;
    int i, k;
//    Nwk_ManGraphCheckLists( p );
    Nwk_ManGraphListExtract( p, pVertex );
    Nwk_ManGraphListExtract( p, pNext );
    // update neihbors of pVertex
    Nwk_VertexForEachAdjacent( p, pVertex, pChanged, i )
    {
        if ( pChanged == pNext )
            continue;
        Nwk_ManGraphListExtract( p, pChanged );
        // move those that use this one
        if ( pChanged->nEdges > 1 )
        Nwk_VertexForEachAdjacent( p, pChanged, pOther, k )
        {
            if ( pOther == pVertex || pOther->nEdges > 1 )
                continue;
            assert( pOther->nEdges == 1 );
            Nwk_ManGraphListExtract( p, pOther );
            pChanged->nEdges--;
            Nwk_ManGraphListInsert( p, pOther );
            pChanged->nEdges++;
        }
        // remove the edge
        Nwk_ManGraphVertexRemoveEdge( pChanged, pVertex );
        // add the changed vertex back
        if ( pChanged->nEdges > 0 )
            Nwk_ManGraphListInsert( p, pChanged );
    }
    // update neihbors of pNext
    Nwk_VertexForEachAdjacent( p, pNext, pChanged, i )
    {
        if ( pChanged == pVertex )
            continue;
        Nwk_ManGraphListExtract( p, pChanged );
        // move those that use this one
        if ( pChanged->nEdges > 1 )
        Nwk_VertexForEachAdjacent( p, pChanged, pOther, k )
        {
            if ( pOther == pNext || pOther->nEdges > 1 )
                continue;
            assert( pOther->nEdges == 1 );
            Nwk_ManGraphListExtract( p, pOther );
            pChanged->nEdges--;
            Nwk_ManGraphListInsert( p, pOther );
            pChanged->nEdges++;
        }
        // remove the edge
        Nwk_ManGraphVertexRemoveEdge( pChanged, pNext );
        // add the changed vertex back
        if ( pChanged->nEdges > 0 )
            Nwk_ManGraphListInsert( p, pChanged );
    }
    // add to the result
    if ( pVertex->Id < pNext->Id )
    {
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pVertex->Id] ); 
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pNext->Id] ); 
    }
    else
    {
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pNext->Id] ); 
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pVertex->Id] ); 
    }
//    Nwk_ManGraphCheckLists( p );
}